

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.cc
# Opt level: O0

string * __thiscall
iqxmlrpc::dump_response_abi_cxx11_(string *__return_storage_ptr__,iqxmlrpc *this,Response *response)

{
  bool bVar1;
  int i;
  Value *this_00;
  string *psVar2;
  Value local_148;
  string local_138;
  Value local_118;
  allocator<char> local_101;
  string local_100;
  Value local_e0;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  Struct fault;
  Node fault_node;
  Node param;
  Node params;
  Value_type_to_xml value_xml_visitor;
  Node local_30;
  Node root;
  XmlBuilder writer;
  Response *response_local;
  
  XmlBuilder::XmlBuilder((XmlBuilder *)&root);
  XmlBuilder::Node::Node(&local_30,(XmlBuilder *)&root,"methodResponse");
  Value_type_to_xml::Value_type_to_xml((Value_type_to_xml *)&params,(XmlBuilder *)&root,true);
  bVar1 = Response::is_fault((Response *)this);
  if (bVar1) {
    XmlBuilder::Node::Node
              ((Node *)&fault.values._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (XmlBuilder *)&root,"fault");
    Struct::Struct((Struct *)local_a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"faultCode",&local_c9);
    i = Response::fault_code((Response *)this);
    Value::Value(&local_e0,i);
    Struct::insert((Struct *)local_a8,&local_c8,&local_e0);
    Value::~Value(&local_e0);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"faultString",&local_101);
    psVar2 = Response::fault_string_abi_cxx11_((Response *)this);
    std::__cxx11::string::string((string *)&local_138,(string *)psVar2);
    Value::Value(&local_118,&local_138);
    Struct::insert((Struct *)local_a8,&local_100,&local_118);
    Value::~Value(&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator(&local_101);
    Value::Value(&local_148,(Struct *)local_a8);
    Value::apply_visitor(&local_148,(Value_type_visitor *)&params);
    Value::~Value(&local_148);
    Struct::~Struct((Struct *)local_a8);
    XmlBuilder::Node::~Node((Node *)&fault.values._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  else {
    XmlBuilder::Node::Node(&param,(XmlBuilder *)&root,"params");
    XmlBuilder::Node::Node(&fault_node,(XmlBuilder *)&root,"param");
    this_00 = Response::value((Response *)this);
    Value::apply_visitor(this_00,(Value_type_visitor *)&params);
    XmlBuilder::Node::~Node(&fault_node);
    XmlBuilder::Node::~Node(&param);
  }
  XmlBuilder::stop((XmlBuilder *)&root);
  XmlBuilder::content_abi_cxx11_(__return_storage_ptr__,(XmlBuilder *)&root);
  Value_type_to_xml::~Value_type_to_xml((Value_type_to_xml *)&params);
  XmlBuilder::Node::~Node(&local_30);
  XmlBuilder::~XmlBuilder((XmlBuilder *)&root);
  return __return_storage_ptr__;
}

Assistant:

std::string
dump_response( const Response& response )
{
  XmlBuilder writer;
  XmlBuilder::Node root(writer, "methodResponse");
  Value_type_to_xml value_xml_visitor(writer, true);

  if (!response.is_fault()) {
    XmlBuilder::Node params(writer, "params");
    XmlBuilder::Node param(writer, "param");
    response.value().apply_visitor(value_xml_visitor);
  } else {
    XmlBuilder::Node fault_node(writer, "fault");
    Struct fault;
    fault.insert( "faultCode", response.fault_code() );
    fault.insert( "faultString", response.fault_string() );
    Value(fault).apply_visitor(value_xml_visitor);
  }

  writer.stop();
  return writer.content();
}